

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_logn_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  uint uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 a_23;
  floatx80 a_24;
  floatx80 a_25;
  floatx80 a_26;
  floatx80 a_27;
  floatx80 a_28;
  floatx80 a_29;
  floatx80 a_30;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  floatx80 fVar18;
  floatx80 fVar19;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  floatx80 b_21;
  floatx80 b_22;
  floatx80 b_23;
  floatx80 b_24;
  floatx80 b_25;
  floatx80 b_26;
  floatx80 b_27;
  floatx80 b_28;
  floatx80 b_29;
  floatx80 b_30;
  floatx80 b_31;
  floatx80 b_32;
  floatx80 b_33;
  int32_t aExp;
  uint64_t aSig;
  uint local_44;
  uint64_t local_40;
  uint64_t local_38;
  
  local_40 = a.low;
  uVar10 = a._8_4_;
  iVar12 = -0x3fff;
  local_44 = uVar10 & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (local_40 == 0) {
      float_raise_m68k('\x04',status);
      uVar7 = 0;
      uVar11 = 0xffff;
      goto LAB_006ef3d6;
    }
    if ((long)local_40 < 0) {
      uVar6 = 0;
    }
    else {
      normalizeFloatx80Subnormal_m68k(local_40,(int32_t *)&local_44,&local_40);
      uVar10 = local_44 + uVar10 + 100;
      iVar12 = -0x4063;
      uVar6 = local_44 + 100;
      local_44 = local_44 + 100;
    }
LAB_006eee58:
    uVar7 = local_40;
    if (-1 < (short)a.high) {
      cVar1 = status->float_rounding_mode;
      cVar2 = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      if (uVar6 * 0x10000 + (uint)(ushort)(local_40 >> 0x30) + 0xc00077be < 0xffff683b) {
        fVar17 = int32_to_floatx80_m68k(iVar12 + uVar6,status);
        b.low = local_40 & 0xfe00000000000000 | 0x100000000000000;
        uVar13 = local_40 >> 0x38;
        a_01._8_8_ = 0x3fff;
        a_01.low = local_40;
        b._8_8_ = 0x3fff;
        fVar14 = floatx80_sub_m68k(a_01,b,status);
        uVar13 = (ulong)(((byte)uVar13 & 0x7e) << 4);
        auVar3 = fVar14._0_12_;
        a_02._12_4_ = 0;
        a_02.low = auVar3._0_8_;
        a_02.high = auVar3._8_2_;
        a_02._10_2_ = auVar3._10_2_;
        b_00._12_4_ = 0;
        b_00._0_12_ = *(undefined1 (*) [12])((long)&log_tbl[0].low + uVar13);
        fVar14 = floatx80_mul_m68k(a_02,b_00,status);
        auVar3 = fVar17._0_12_;
        a_03._12_4_ = 0;
        a_03.low = auVar3._0_8_;
        a_03.high = auVar3._8_2_;
        a_03._10_2_ = auVar3._10_2_;
        b_01._8_8_ = 0x3ffe;
        b_01.low = 0xb17217f7d1cf79ac;
        fVar17 = floatx80_mul_m68k(a_03,b_01,status);
        uVar7 = fVar17.low;
        uVar11 = fVar17._8_4_;
        auVar3 = fVar14._0_12_;
        a_04._12_4_ = 0;
        a_04.low = auVar3._0_8_;
        a_04.high = auVar3._8_2_;
        a_04._10_2_ = auVar3._10_2_;
        b_02._12_4_ = 0;
        b_02.low = auVar3._0_8_;
        b_02.high = auVar3._8_2_;
        b_02._10_2_ = auVar3._10_2_;
        fVar17 = floatx80_mul_m68k(a_04,b_02,status);
        fVar14 = float64_to_floatx80_m68k(0x3fc2499ab5e4040b,status);
        b_03._8_8_ = fVar14._8_8_ & 0xffffffff;
        auVar4 = fVar17._0_12_;
        a_05._12_4_ = 0;
        a_05.low = auVar4._0_8_;
        a_05.high = auVar4._8_2_;
        a_05._10_2_ = auVar4._10_2_;
        b_03.low = fVar14.low;
        fVar14 = floatx80_mul_m68k(a_05,b_03,status);
        fVar15 = float64_to_floatx80_m68k(0xbfc555b5848cb7db,status);
        b_04._8_8_ = fVar15._8_8_ & 0xffffffff;
        a_06._12_4_ = 0;
        a_06.low = auVar4._0_8_;
        a_06.high = auVar4._8_2_;
        a_06._10_2_ = auVar4._10_2_;
        b_04.low = fVar15.low;
        fVar15 = floatx80_mul_m68k(a_06,b_04,status);
        fVar16 = float64_to_floatx80_m68k(0x3fc99999987d8730,status);
        b_05._8_8_ = fVar16._8_8_ & 0xffffffff;
        auVar5 = fVar14._0_12_;
        a_07._12_4_ = 0;
        a_07.low = auVar5._0_8_;
        a_07.high = auVar5._8_2_;
        a_07._10_2_ = auVar5._10_2_;
        b_05.low = fVar16.low;
        fVar14 = floatx80_add_m68k(a_07,b_05,status);
        fVar16 = float64_to_floatx80_m68k(0xbfcfffffff6f7e97,status);
        b_06._8_8_ = fVar16._8_8_ & 0xffffffff;
        auVar5 = fVar15._0_12_;
        a_08._12_4_ = 0;
        a_08.low = auVar5._0_8_;
        a_08.high = auVar5._8_2_;
        a_08._10_2_ = auVar5._10_2_;
        b_06.low = fVar16.low;
        fVar15 = floatx80_add_m68k(a_08,b_06,status);
        auVar5 = fVar14._0_12_;
        a_09._12_4_ = 0;
        a_09.low = auVar5._0_8_;
        a_09.high = auVar5._8_2_;
        a_09._10_2_ = auVar5._10_2_;
        b_07._12_4_ = 0;
        b_07.low = auVar4._0_8_;
        b_07.high = auVar4._8_2_;
        b_07._10_2_ = auVar4._10_2_;
        local_38 = fVar17.low;
        fVar14 = floatx80_mul_m68k(a_09,b_07,status);
        auVar5 = fVar15._0_12_;
        a_10._12_4_ = 0;
        a_10.low = auVar5._0_8_;
        a_10.high = auVar5._8_2_;
        a_10._10_2_ = auVar5._10_2_;
        b_08._12_4_ = 0;
        b_08.low = auVar4._0_8_;
        b_08.high = auVar4._8_2_;
        b_08._10_2_ = auVar4._10_2_;
        fVar15 = floatx80_mul_m68k(a_10,b_08,status);
        fVar16 = float64_to_floatx80_m68k(0x3fd55555555555a4,status);
        b_09._8_8_ = fVar16._8_8_ & 0xffffffff;
        auVar4 = fVar14._0_12_;
        a_11._12_4_ = 0;
        a_11.low = auVar4._0_8_;
        a_11.high = auVar4._8_2_;
        a_11._10_2_ = auVar4._10_2_;
        b_09.low = fVar16.low;
        fVar14 = floatx80_add_m68k(a_11,b_09,status);
        fVar16 = float64_to_floatx80_m68k(0xbfe0000000000008,status);
        b_10._8_8_ = fVar16._8_8_ & 0xffffffff;
        auVar4 = fVar15._0_12_;
        a_12._12_4_ = 0;
        a_12.low = auVar4._0_8_;
        a_12.high = auVar4._8_2_;
        a_12._10_2_ = auVar4._10_2_;
        b_10.low = fVar16.low;
        fVar15 = floatx80_add_m68k(a_12,b_10,status);
        uVar8 = local_38;
        auVar4 = fVar14._0_12_;
        a_13._12_4_ = 0;
        a_13.low = auVar4._0_8_;
        a_13.high = auVar4._8_2_;
        a_13._10_2_ = auVar4._10_2_;
        b_11._8_4_ = fVar17._8_4_;
        b_11.low = local_38;
        b_11._12_4_ = 0;
        fVar14 = floatx80_mul_m68k(a_13,b_11,status);
        auVar4 = fVar15._0_12_;
        a_14._12_4_ = 0;
        a_14.low = auVar4._0_8_;
        a_14.high = auVar4._8_2_;
        a_14._10_2_ = auVar4._10_2_;
        b_12._8_4_ = fVar17._8_4_;
        b_12.low = uVar8;
        b_12._12_4_ = 0;
        fVar17 = floatx80_mul_m68k(a_14,b_12,status);
        auVar4 = fVar14._0_12_;
        a_15._12_4_ = 0;
        a_15.low = auVar4._0_8_;
        a_15.high = auVar4._8_2_;
        a_15._10_2_ = auVar4._10_2_;
        b_13._12_4_ = 0;
        b_13.low = auVar3._0_8_;
        b_13.high = auVar3._8_2_;
        b_13._10_2_ = auVar3._10_2_;
        fVar14 = floatx80_mul_m68k(a_15,b_13,status);
        a_16._12_4_ = 0;
        a_16.low = auVar3._0_8_;
        a_16.high = auVar3._8_2_;
        a_16._10_2_ = auVar3._10_2_;
        auVar3 = fVar17._0_12_;
        b_14._12_4_ = 0;
        b_14.low = auVar3._0_8_;
        b_14.high = auVar3._8_2_;
        b_14._10_2_ = auVar3._10_2_;
        fVar17 = floatx80_add_m68k(a_16,b_14,status);
        auVar3 = fVar14._0_12_;
        a_17._12_4_ = 0;
        a_17.low = auVar3._0_8_;
        a_17.high = auVar3._8_2_;
        a_17._10_2_ = auVar3._10_2_;
        b_15._12_4_ = 0;
        b_15._0_12_ = *(undefined1 (*) [12])((long)&log_tbl[1].low + uVar13);
        fVar14 = floatx80_add_m68k(a_17,b_15,status);
        b_16._8_8_ = fVar14._8_8_ & 0xffffffff;
        auVar3 = fVar17._0_12_;
        a_18._12_4_ = 0;
        a_18.low = auVar3._0_8_;
        a_18.high = auVar3._8_2_;
        a_18._10_2_ = auVar3._10_2_;
        b_16.low = fVar14.low;
        fVar17 = floatx80_add_m68k(a_18,b_16,status);
        uVar8 = fVar17.low;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        uVar9 = fVar17._8_4_;
      }
      else {
        fVar14 = float32_to_floatx80_m68k(0x3f800000,status);
        b_17._8_8_ = fVar14._8_8_ & 0xffffffff;
        fVar17._8_4_ = uVar10;
        fVar17.low = uVar7;
        fVar17._12_4_ = 0;
        b_17.low = fVar14.low;
        fVar17 = floatx80_sub_m68k(fVar17,b_17,status);
        fVar15 = float32_to_floatx80_m68k(0x3f800000,status);
        b_18._8_8_ = fVar15._8_8_ & 0xffffffff;
        fVar14._8_4_ = uVar10;
        fVar14.low = uVar7;
        fVar14._12_4_ = 0;
        b_18.low = fVar15.low;
        fVar14 = floatx80_add_m68k(fVar14,b_18,status);
        auVar3 = fVar17._0_12_;
        fVar15._12_4_ = 0;
        fVar15.low = auVar3._0_8_;
        fVar15.high = auVar3._8_2_;
        fVar15._10_2_ = auVar3._10_2_;
        b_19._12_4_ = 0;
        b_19.low = auVar3._0_8_;
        b_19.high = auVar3._8_2_;
        b_19._10_2_ = auVar3._10_2_;
        fVar17 = floatx80_add_m68k(fVar15,b_19,status);
        auVar3 = fVar17._0_12_;
        fVar16._12_4_ = 0;
        fVar16.low = auVar3._0_8_;
        fVar16.high = auVar3._8_2_;
        fVar16._10_2_ = auVar3._10_2_;
        auVar3 = fVar14._0_12_;
        b_20._12_4_ = 0;
        b_20.low = auVar3._0_8_;
        b_20.high = auVar3._8_2_;
        b_20._10_2_ = auVar3._10_2_;
        fVar17 = floatx80_div_m68k(fVar16,b_20,status);
        uVar7 = fVar17.low;
        b_21._8_8_ = fVar17._8_8_ & 0xffffffff;
        uVar11 = fVar17._8_4_;
        fVar18._8_8_ = fVar17._8_8_ & 0xffffffff;
        fVar18.low = uVar7;
        b_21.low = uVar7;
        fVar14 = floatx80_mul_m68k(fVar18,b_21,status);
        b_22._8_8_ = fVar14._8_8_ & 0xffffffff;
        a_19._8_8_ = fVar14._8_8_ & 0xffffffff;
        a_19.low = fVar14.low;
        b_22.low = fVar14.low;
        fVar15 = floatx80_mul_m68k(a_19,b_22,status);
        fVar16 = float64_to_floatx80_m68k(0x3f175496add7dad6,status);
        fVar18 = float64_to_floatx80_m68k(0x3f3c71c2fe80c7e0,status);
        auVar3 = fVar16._0_12_;
        a_20._12_4_ = 0;
        a_20.low = auVar3._0_8_;
        a_20.high = auVar3._8_2_;
        a_20._10_2_ = auVar3._10_2_;
        auVar3 = fVar15._0_12_;
        b_23._12_4_ = 0;
        b_23.low = auVar3._0_8_;
        b_23.high = auVar3._8_2_;
        b_23._10_2_ = auVar3._10_2_;
        fVar15 = floatx80_mul_m68k(a_20,b_23,status);
        auVar4 = fVar18._0_12_;
        a_21._12_4_ = 0;
        a_21.low = auVar4._0_8_;
        a_21.high = auVar4._8_2_;
        a_21._10_2_ = auVar4._10_2_;
        b_24._12_4_ = 0;
        b_24.low = auVar3._0_8_;
        b_24.high = auVar3._8_2_;
        b_24._10_2_ = auVar3._10_2_;
        fVar16 = floatx80_mul_m68k(a_21,b_24,status);
        fVar18 = float64_to_floatx80_m68k(0x3f624924928bccff,status);
        b_25._8_8_ = fVar18._8_8_ & 0xffffffff;
        auVar4 = fVar15._0_12_;
        a_22._12_4_ = 0;
        a_22.low = auVar4._0_8_;
        a_22.high = auVar4._8_2_;
        a_22._10_2_ = auVar4._10_2_;
        b_25.low = fVar18.low;
        fVar15 = floatx80_add_m68k(a_22,b_25,status);
        fVar18 = float64_to_floatx80_m68k(0x3f899999999995ec,status);
        b_26._8_8_ = fVar18._8_8_ & 0xffffffff;
        auVar4 = fVar16._0_12_;
        a_23._12_4_ = 0;
        a_23.low = auVar4._0_8_;
        a_23.high = auVar4._8_2_;
        a_23._10_2_ = auVar4._10_2_;
        b_26.low = fVar18.low;
        fVar16 = floatx80_add_m68k(a_23,b_26,status);
        a_24._12_4_ = 0;
        a_24.low = auVar3._0_8_;
        a_24.high = auVar3._8_2_;
        a_24._10_2_ = auVar3._10_2_;
        auVar3 = fVar15._0_12_;
        b_27._12_4_ = 0;
        b_27.low = auVar3._0_8_;
        b_27.high = auVar3._8_2_;
        b_27._10_2_ = auVar3._10_2_;
        fVar15 = floatx80_mul_m68k(a_24,b_27,status);
        auVar3 = fVar16._0_12_;
        a_25._12_4_ = 0;
        a_25.low = auVar3._0_8_;
        a_25.high = auVar3._8_2_;
        a_25._10_2_ = auVar3._10_2_;
        auVar3 = fVar14._0_12_;
        b_28._12_4_ = 0;
        b_28.low = auVar3._0_8_;
        b_28.high = auVar3._8_2_;
        b_28._10_2_ = auVar3._10_2_;
        fVar14 = floatx80_mul_m68k(a_25,b_28,status);
        fVar16 = float64_to_floatx80_m68k(0x3fb5555555555555,status);
        b_29._8_8_ = fVar16._8_8_ & 0xffffffff;
        auVar4 = fVar15._0_12_;
        a_26._12_4_ = 0;
        a_26.low = auVar4._0_8_;
        a_26.high = auVar4._8_2_;
        a_26._10_2_ = auVar4._10_2_;
        b_29.low = fVar16.low;
        fVar15 = floatx80_add_m68k(a_26,b_29,status);
        a_27._12_4_ = 0;
        a_27.low = auVar3._0_8_;
        a_27.high = auVar3._8_2_;
        a_27._10_2_ = auVar3._10_2_;
        auVar3 = fVar17._0_12_;
        b_30._12_4_ = 0;
        b_30.low = auVar3._0_8_;
        b_30.high = auVar3._8_2_;
        b_30._10_2_ = auVar3._10_2_;
        fVar17 = floatx80_mul_m68k(a_27,b_30,status);
        auVar4 = fVar14._0_12_;
        auVar3 = fVar15._0_12_;
        a_28._12_4_ = 0;
        a_28.low = auVar3._0_8_;
        a_28.high = auVar3._8_2_;
        a_28._10_2_ = auVar3._10_2_;
        b_31._12_4_ = 0;
        b_31.low = auVar4._0_8_;
        b_31.high = auVar4._8_2_;
        b_31._10_2_ = auVar4._10_2_;
        fVar14 = floatx80_add_m68k(a_28,b_31,status);
        b_32._8_8_ = fVar14._8_8_ & 0xffffffff;
        auVar3 = fVar17._0_12_;
        a_29._12_4_ = 0;
        a_29.low = auVar3._0_8_;
        a_29.high = auVar3._8_2_;
        a_29._10_2_ = auVar3._10_2_;
        b_32.low = fVar14.low;
        fVar17 = floatx80_mul_m68k(a_29,b_32,status);
        uVar8 = fVar17.low;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        uVar9 = fVar17._8_4_;
      }
      a_30._8_4_ = uVar9;
      a_30.low = uVar8;
      a_30._12_4_ = 0;
      b_33._8_4_ = uVar11;
      b_33.low = uVar7;
      b_33._12_4_ = 0;
      fVar17 = floatx80_add_m68k(a_30,b_33,status);
      uVar7 = fVar17.low;
      uVar11 = fVar17._8_4_;
      float_raise_m68k(' ',status);
      goto LAB_006ef3d6;
    }
  }
  else {
    uVar6 = local_44;
    if (local_44 != 0x7fff) goto LAB_006eee58;
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      auVar3 = a._0_12_;
      a_00._12_4_ = 0;
      a_00.low = auVar3._0_8_;
      a_00.high = auVar3._8_2_;
      a_00._10_2_ = auVar3._10_2_;
      propagateFloatx80NaNOneArg(a_00,status);
    }
    if (-1 < (short)a.high) {
      uVar11 = 0x7fff;
      uVar7 = 0;
      goto LAB_006ef3d6;
    }
  }
  float_raise_m68k('\x01',status);
  fVar17 = floatx80_default_nan_m68k(status);
  uVar7 = fVar17.low;
  uVar11 = fVar17._8_4_;
LAB_006ef3d6:
  fVar19._8_4_ = uVar11;
  fVar19.low = uVar7;
  fVar19._12_4_ = 0;
  return fVar19;
}

Assistant:

floatx80 floatx80_logn(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig, fSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, j, k, adjk;
    floatx80 fp0, fp1, fp2, fp3, f, logof2, klog2, saveu;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign == 0) {
            return packFloatx80(0, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
    }

    adjk = 0;

    if (aExp == 0) {
        if (aSig == 0) { /* zero */
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(1, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
        if ((aSig & one_sig) == 0) { /* denormal */
            normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
            adjk = -100;
            aExp += 100;
            a = packFloatx80(aSign, aExp, aSig);
        }
    }

    if (aSign) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact < 0x3FFEF07D || compact > 0x3FFF8841) {
        /* |X| < 15/16 or |X| > 17/16 */
        k = aExp - 0x3FFF;
        k += adjk;
        fp1 = int32_to_floatx80(k, status);

        fSig = (aSig & UINT64_C(0xFE00000000000000)) | UINT64_C(0x0100000000000000);
        j = (fSig >> 56) & 0x7E; /* DISPLACEMENT FOR 1/F */

        f = packFloatx80(0, 0x3FFF, fSig); /* F */
        fp0 = packFloatx80(0, 0x3FFF, aSig); /* Y */

        fp0 = floatx80_sub(fp0, f, status); /* Y-F */

        /* LP1CONT1 */
        fp0 = floatx80_mul(fp0, log_tbl[j], status); /* FP0 IS U = (Y-F)/F */
        logof2 = packFloatx80(0, 0x3FFE, UINT64_C(0xB17217F7D1CF79AC));
        klog2 = floatx80_mul(fp1, logof2, status); /* FP1 IS K*LOG2 */
        fp2 = floatx80_mul(fp0, fp0, status); /* FP2 IS V=U*U */

        fp3 = fp2;
        fp1 = fp2;

        fp1 = floatx80_mul(fp1, float64_to_floatx80(
                           make_float64(0x3FC2499AB5E4040B), status),
                           status); /* V*A6 */
        fp2 = floatx80_mul(fp2, float64_to_floatx80(
                           make_float64(0xBFC555B5848CB7DB), status),
                           status); /* V*A5 */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FC99999987D8730), status),
                           status); /* A4+V*A6 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0xBFCFFFFFFF6F7E97), status),
                           status); /* A3+V*A5 */
        fp1 = floatx80_mul(fp1, fp3, status); /* V*(A4+V*A6) */
        fp2 = floatx80_mul(fp2, fp3, status); /* V*(A3+V*A5) */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FD55555555555A4), status),
                           status); /* A2+V*(A4+V*A6) */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0xBFE0000000000008), status),
                           status); /* A1+V*(A3+V*A5) */
        fp1 = floatx80_mul(fp1, fp3, status); /* V*(A2+V*(A4+V*A6)) */
        fp2 = floatx80_mul(fp2, fp3, status); /* V*(A1+V*(A3+V*A5)) */
        fp1 = floatx80_mul(fp1, fp0, status); /* U*V*(A2+V*(A4+V*A6)) */
        fp0 = floatx80_add(fp0, fp2, status); /* U+V*(A1+V*(A3+V*A5)) */

        fp1 = floatx80_add(fp1, log_tbl[j + 1],
                           status); /* LOG(F)+U*V*(A2+V*(A4+V*A6)) */
        fp0 = floatx80_add(fp0, fp1, status); /* FP0 IS LOG(F) + LOG(1+U) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, klog2, status);

        float_raise(float_flag_inexact, status);

        return a;
    } else { /* |X-1| >= 1/16 */
        fp0 = a;
        fp1 = a;
        fp1 = floatx80_sub(fp1, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* FP1 IS X-1 */
        fp0 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* FP0 IS X+1 */
        fp1 = floatx80_add(fp1, fp1, status); /* FP1 IS 2(X-1) */

        /* LP1CONT2 */
        fp1 = floatx80_div(fp1, fp0, status); /* U */
        saveu = fp1;
        fp0 = floatx80_mul(fp1, fp1, status); /* FP0 IS V = U*U */
        fp1 = floatx80_mul(fp0, fp0, status); /* FP1 IS W = V*V */

        fp3 = float64_to_floatx80(make_float64(0x3F175496ADD7DAD6),
                                  status); /* B5 */
        fp2 = float64_to_floatx80(make_float64(0x3F3C71C2FE80C7E0),
                                  status); /* B4 */
        fp3 = floatx80_mul(fp3, fp1, status); /* W*B5 */
        fp2 = floatx80_mul(fp2, fp1, status); /* W*B4 */
        fp3 = floatx80_add(fp3, float64_to_floatx80(
                           make_float64(0x3F624924928BCCFF), status),
                           status); /* B3+W*B5 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x3F899999999995EC), status),
                           status); /* B2+W*B4 */
        fp1 = floatx80_mul(fp1, fp3, status); /* W*(B3+W*B5) */
        fp2 = floatx80_mul(fp2, fp0, status); /* V*(B2+W*B4) */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FB5555555555555), status),
                           status); /* B1+W*(B3+W*B5) */

        fp0 = floatx80_mul(fp0, saveu, status); /* FP0 IS U*V */
        fp1 = floatx80_add(fp1, fp2, status); /* B1+W*(B3+W*B5) + V*(B2+W*B4) */
        fp0 = floatx80_mul(fp0, fp1,
                           status); /* U*V*([B1+W*(B3+W*B5)] + [V*(B2+W*B4)]) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, saveu, status);

        /*if (!floatx80_is_zero(a)) { */
            float_raise(float_flag_inexact, status);
        /*} */

        return a;
    }
}